

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Logger.cpp
# Opt level: O0

void pobr::utils::Logger::debugFatal(string *message)

{
  Exception *this;
  allocator local_91;
  string local_90;
  uint local_70;
  allocator local_69;
  string local_68;
  allocator local_31;
  string local_30;
  string *local_10;
  string *message_local;
  
  local_10 = message;
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_30,"Fatal",&local_31);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_68,"magenta",&local_69);
  TerminalPrinter::printLabel(&local_30,&local_68);
  std::__cxx11::string::~string((string *)&local_68);
  std::allocator<char>::~allocator((allocator<char> *)&local_69);
  std::__cxx11::string::~string((string *)&local_30);
  std::allocator<char>::~allocator((allocator<char> *)&local_31);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_90,"Fatal",&local_91);
  local_70 = TerminalPrinter::getLabelLength(&local_90);
  print(&local_70,local_10);
  std::__cxx11::string::~string((string *)&local_90);
  std::allocator<char>::~allocator((allocator<char> *)&local_91);
  this = (Exception *)__cxa_allocate_exception(0x28);
  Exception::Exception(this,local_10);
  __cxa_throw(this,&Exception::typeinfo,Exception::~Exception);
}

Assistant:

void Logger::debugFatal(const std::string& message)
{
    Logger::printLabel("Fatal", "magenta");
    Logger::print(Logger::getLabelLength("Fatal"), message);

    throw Logger::Exception(message);
}